

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

Scl_Tree_t * Scl_LibertyStart(char *pFileName)

{
  int iVar1;
  Scl_Tree_t *pSVar2;
  abctime aVar3;
  char *pcVar4;
  char *pcVar5;
  Scl_Item_t *pSVar6;
  Vec_Str_t *pVVar7;
  
  Scl_LibertyFixFileName(pFileName);
  iVar1 = Scl_LibertyFileSize(pFileName);
  if (iVar1 == 0) {
    pSVar2 = (Scl_Tree_t *)0x0;
  }
  else {
    pSVar2 = (Scl_Tree_t *)calloc(1,0x40);
    aVar3 = Abc_Clock();
    pSVar2->clkStart = aVar3;
    pSVar2->nContents = iVar1;
    pcVar4 = Scl_LibertyFileContents(pFileName,iVar1);
    pSVar2->pContents = pcVar4;
    pcVar5 = Abc_UtilStrsav(pFileName);
    pSVar2->pFileName = pcVar5;
    iVar1 = Scl_LibertyCountItems(pcVar4,pcVar4 + iVar1);
    pSVar2->nItermAlloc = iVar1 + 10;
    pSVar6 = (Scl_Item_t *)calloc((long)(iVar1 + 10),0x28);
    pSVar2->pItems = pSVar6;
    pSVar2->nLines = 1;
    pVVar7 = Vec_StrAlloc(10);
    pVVar7->nSize = 10;
    pcVar4 = pVVar7->pArray;
    pcVar4[8] = '\0';
    pcVar4[9] = '\0';
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    pSVar2->vBuffer = pVVar7;
  }
  return pSVar2;
}

Assistant:

Scl_Tree_t * Scl_LibertyStart( char * pFileName )
{
    Scl_Tree_t * p;
    int RetValue;
    // read the file into the buffer
    Scl_LibertyFixFileName( pFileName );
    RetValue = Scl_LibertyFileSize( pFileName );
    if ( RetValue == 0 )
        return NULL;
    // start the manager
    p = ABC_ALLOC( Scl_Tree_t, 1 );
    memset( p, 0, sizeof(Scl_Tree_t) );
    p->clkStart  = Abc_Clock();
    p->nContents = RetValue;
    p->pContents = Scl_LibertyFileContents( pFileName, p->nContents );
    // other 
    p->pFileName = Abc_UtilStrsav( pFileName );
    p->nItermAlloc = 10 + Scl_LibertyCountItems( p->pContents, p->pContents+p->nContents );
    p->pItems = ABC_CALLOC( Scl_Item_t, p->nItermAlloc );
    p->nItems = 0;
    p->nLines = 1;
    p->vBuffer = Vec_StrStart( 10 );
    return p;
}